

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void absl::lts_20250127::str_format_internal::anon_unknown_0::PrintExponent
               (int exp,char e,Buffer *out)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  
  Buffer::push_back(out,e);
  if (exp < 0) {
    Buffer::push_back(out,'-');
    exp = -exp;
  }
  else {
    Buffer::push_back(out,'+');
  }
  if ((uint)exp < 100) {
    uVar2 = (ushort)exp & 0xff;
    bVar1 = (byte)(uVar2 / 10);
    bVar3 = (byte)(uVar2 % 10);
  }
  else {
    Buffer::push_back(out,(char)((ulong)(uint)exp / 100) + '0');
    bVar3 = (byte)((ulong)(uint)exp % 10);
    bVar1 = (byte)(((ulong)(uint)exp / 10) % 10);
  }
  Buffer::push_back(out,bVar1 | 0x30);
  Buffer::push_back(out,bVar3 | 0x30);
  return;
}

Assistant:

void PrintExponent(int exp, char e, Buffer *out) {
  out->push_back(e);
  if (exp < 0) {
    out->push_back('-');
    exp = -exp;
  } else {
    out->push_back('+');
  }
  // Exponent digits.
  if (exp > 99) {
    out->push_back(static_cast<char>(exp / 100 + '0'));
    out->push_back(static_cast<char>(exp / 10 % 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  } else {
    out->push_back(static_cast<char>(exp / 10 + '0'));
    out->push_back(static_cast<char>(exp % 10 + '0'));
  }
}